

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O1

int random_number(int min,int max)

{
  result_type rVar1;
  uint uVar2;
  initializer_list<int> __il;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  seed_seq seed;
  param_type local_48;
  uint local_3c;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  seed_seq local_30;
  
  local_48._M_a = random_number::iteration;
  __il._M_len = 1;
  __il._M_array = &local_48._M_a;
  random_number::iteration = random_number::iteration + 1;
  std::seed_seq::seed_seq<int,void>(&local_30,__il);
  std::seed_seq::generate<unsigned_int*>(&local_30,(uint *)&local_48,(uint *)&local_38);
  uVar2 = local_3c / 0x7fffffff << 0x1f | local_3c / 0x7fffffff;
  local_38._M_x = (unsigned_long)(uVar2 + local_3c + (uint)(local_3c + uVar2 == 0));
  local_48._M_a = min;
  local_48._M_b = max;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_48,&local_38,&local_48);
  if (local_30._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return rVar1;
}

Assistant:

int random_number(int min, int max)
{
    // We want predictable test results, so we always
    // start with the seed 0.
    static int iteration = 0;

    std::seed_seq seed{iteration++};
    std::default_random_engine engine{seed};
    std::uniform_int_distribution<> distribution(min, max);

    const int random_number = distribution(engine);
    return random_number;
}